

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options_boost_po.h
# Opt level: O2

bool __thiscall
VW::config::options_boost_po::add_if_t<char>
          (options_boost_po *this,shared_ptr<VW::config::base_option> *opt,
          options_description *options_description)

{
  size_t sVar1;
  size_t sVar2;
  shared_ptr<VW::config::typed_option<char>_> typed;
  __shared_ptr<VW::config::typed_option<char>,_(__gnu_cxx::_Lock_policy)2> local_50;
  __shared_ptr<VW::config::typed_option<char>,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  sVar1 = ((opt->super___shared_ptr<VW::config::base_option,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
          m_type_hash;
  sVar2 = std::type_info::hash_code((type_info *)&char::typeinfo);
  if (sVar1 == sVar2) {
    std::dynamic_pointer_cast<VW::config::typed_option<char>,VW::config::base_option>
              ((shared_ptr<VW::config::base_option> *)&local_40);
    std::__shared_ptr<VW::config::typed_option<char>,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_50,&local_40);
    add_to_description<char>
              (this,(shared_ptr<VW::config::typed_option<char>_> *)&local_50,options_description);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  }
  return sVar1 == sVar2;
}

Assistant:

bool options_boost_po::add_if_t(std::shared_ptr<base_option> opt, po::options_description& options_description)
{
  if (opt->m_type_hash == typeid(T).hash_code())
  {
    auto typed = std::dynamic_pointer_cast<typed_option<T>>(opt);
    add_to_description(typed, options_description);
    return true;
  }

  return false;
}